

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::setPalette(QStyleSheetStyle *this,QWidget *w)

{
  byte bVar1;
  bool bVar2;
  QPalette *pQVar3;
  QStyleSheetStyle *this_00;
  long lVar4;
  QStyleSheetStyle *in_RSI;
  long in_FS_OFFSET;
  int i;
  QWidget *ew;
  bool useStyleSheetPropagationInWidgetStyles;
  QPalette wp;
  QRenderRule rule;
  QPalette p;
  RuleRoleMap map [3];
  QPalette *in_stack_fffffffffffffe68;
  QRenderRule *in_stack_fffffffffffffe70;
  QStyleSheetStyle *font;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  QWidgetPrivate *in_stack_fffffffffffffe88;
  int local_14c;
  QPalette local_128;
  QPalette local_118;
  QWidget *in_stack_fffffffffffffef8;
  undefined1 local_100 [16];
  QFont local_f0 [16];
  undefined1 local_e0 [47];
  undefined1 in_stack_ffffffffffffff4f;
  QWidget *in_stack_ffffffffffffff50;
  ColorGroup in_stack_ffffffffffffff5c;
  QPalette *in_stack_ffffffffffffff60;
  QRenderRule *in_stack_ffffffffffffff68;
  quint64 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  QObject *in_stack_ffffffffffffff88;
  undefined1 local_58 [16];
  QVariant local_48;
  int local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = -0x7fffffff;
  local_28[1] = 0;
  local_28[2] = 2;
  local_28[3] = 1;
  local_28[4] = 1;
  local_28[5] = 2;
  bVar1 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  bVar1 = bVar1 & 1;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)local_58);
  if (bVar1 == 0) {
    pQVar3 = QWidget::palette((QWidget *)in_stack_fffffffffffffe70);
    QPalette::operator=((QPalette *)local_58,(QPalette *)pQVar3);
  }
  this_00 = (QStyleSheetStyle *)embeddedWidget((QWidget *)in_stack_fffffffffffffe88);
  for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
    memset(local_e0,0xaa,0x88);
    in_stack_fffffffffffffe88 = (QWidgetPrivate *)(long)local_28[(long)local_14c * 2];
    extendedPseudoClass((QWidget *)in_RSI);
    renderRule(this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
              );
    if (local_14c == 0) {
      QObject::property((char *)&local_48);
      bVar2 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe87 = bVar2 ^ 0xff;
      ::QVariant::~QVariant(&local_48);
      if ((in_stack_fffffffffffffe87 & 1) != 0) {
        font = in_RSI;
        QWidget::d_func((QWidget *)0x42a7eb);
        QWidgetPrivate::localFont(in_stack_fffffffffffffe88);
        saveWidgetFont((QStyleSheetStyle *)in_stack_fffffffffffffe88,
                       (QWidget *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       (QFont *)font);
        QFont::~QFont(local_f0);
      }
      updateStyleSheetFont(this_00,in_stack_fffffffffffffef8);
      if (this_00 != in_RSI) {
        updateStyleSheetFont(this_00,in_stack_fffffffffffffef8);
      }
    }
    QRenderRule::configurePalette
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
    QRenderRule::~QRenderRule(in_stack_fffffffffffffe70);
  }
  if ((bVar1 == 0) || (lVar4 = QPalette::resolveMask(), lVar4 != 0)) {
    local_100._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_100._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QWidget::palette((QWidget *)in_stack_fffffffffffffe70);
    QPalette::QPalette((QPalette *)local_100,(QPalette *)pQVar3);
    pQVar3 = (QPalette *)&styleSheetCaches->customPaletteWidgets;
    QPalette::QPalette(&local_118,(QPalette *)local_100);
    QPalette::resolveMask();
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::insert
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *)pQVar3,
               (QWidget **)in_stack_fffffffffffffe68,(Tampered<QPalette> *)0x42a94a);
    QStyleSheetStyleCaches::Tampered<QPalette>::~Tampered((Tampered<QPalette> *)0x42a961);
    if (bVar1 != 0) {
      QPalette::resolve((QPalette *)&local_128);
      QPalette::operator=(pQVar3,in_stack_fffffffffffffe68);
      QPalette::~QPalette(&local_128);
      QPalette::resolveMask();
      QPalette::resolveMask();
      QPalette::setResolveMask((ulonglong)local_58);
    }
    QWidget::setPalette((QWidget *)in_stack_fffffffffffffe88,
                        (QPalette *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    if (this_00 != in_RSI) {
      QWidget::setPalette((QWidget *)in_stack_fffffffffffffe88,
                          (QPalette *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80))
      ;
    }
    QPalette::~QPalette((QPalette *)local_100);
  }
  QPalette::~QPalette((QPalette *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::setPalette(QWidget *w)
{
    struct RuleRoleMap {
        int state;
        QPalette::ColorGroup group;
    } map[3] = {
        { int(PseudoClass_Active | PseudoClass_Enabled), QPalette::Active },
        { PseudoClass_Disabled, QPalette::Disabled },
        { PseudoClass_Enabled, QPalette::Inactive }
    };

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QPalette p;
    if (!useStyleSheetPropagationInWidgetStyles)
        p = w->palette();

    QWidget *ew = embeddedWidget(w);

    for (int i = 0; i < 3; i++) {
        QRenderRule rule = renderRule(w, PseudoElement_None, map[i].state | extendedPseudoClass(w));
        if (i == 0) {
            if (!w->property("_q_styleSheetWidgetFont").isValid()) {
                saveWidgetFont(w, w->d_func()->localFont());
            }
            updateStyleSheetFont(w);
            if (ew != w)
                updateStyleSheetFont(ew);
        }

        rule.configurePalette(&p, map[i].group, ew, ew != w);
    }

    if (!useStyleSheetPropagationInWidgetStyles || p.resolveMask() != 0) {
        QPalette wp = w->palette();
        styleSheetCaches->customPaletteWidgets.insert(w, {wp, p.resolveMask()});

        if (useStyleSheetPropagationInWidgetStyles) {
            p = p.resolve(wp);
            p.setResolveMask(p.resolveMask() | wp.resolveMask());
        }

        w->setPalette(p);
        if (ew != w)
            ew->setPalette(p);
    }
}